

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH_errorcode XXH32_update(XXH32_state_t *state,void *input,size_t len)

{
  uint uVar1;
  XXH32_hash_t XVar2;
  xxh_u8 *limit;
  ulong uVar3;
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined1 auVar6 [16];
  XXH32_hash_t XVar13;
  undefined1 auVar11 [16];
  XXH32_hash_t XVar14;
  undefined1 auVar12 [16];
  XXH32_hash_t XVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (input == (void *)0x0) {
    return XXH_ERROR;
  }
  uVar1 = state->total_len_32 + (int)len;
  state->total_len_32 = uVar1;
  state->large_len = state->large_len | (uint)(0xf < uVar1 || 0xf < len);
  uVar3 = (ulong)state->memsize;
  if (uVar3 + len < 0x10) {
    memcpy((void *)((long)state->mem32 + uVar3),input,len);
    XVar2 = state->memsize + (int)len;
  }
  else {
    pauVar4 = (undefined1 (*) [16])(len + (long)input);
    if (uVar3 != 0) {
      memcpy((void *)((long)state->mem32 + uVar3),input,(ulong)(0x10 - state->memsize));
      auVar5 = *(undefined1 (*) [16])state->mem32;
      iVar7 = auVar5._4_4_;
      auVar15._4_4_ = iVar7;
      auVar15._0_4_ = iVar7;
      auVar15._8_4_ = auVar5._12_4_;
      auVar15._12_4_ = auVar5._12_4_;
      uVar1 = auVar5._0_4_ * -0x7a143589 + state->v1;
      uVar8 = iVar7 * -0x7a143589 + state->v2;
      uVar9 = (int)((auVar5._8_8_ & 0xffffffff) * 0x85ebca77) + state->v3;
      uVar10 = (int)((auVar15._8_8_ & 0xffffffff) * 0x85ebca77) + state->v4;
      auVar5._0_4_ = uVar1 >> 0x13;
      auVar5._4_4_ = uVar8 >> 0x13;
      auVar5._8_4_ = uVar9 >> 0x13;
      auVar5._12_4_ = uVar10 >> 0x13;
      auVar6._0_4_ = uVar1 * 0x2000;
      auVar6._4_4_ = uVar8 * 0x2000;
      auVar6._8_4_ = uVar9 * 0x2000;
      auVar6._12_4_ = uVar10 * 0x2000;
      auVar6 = auVar6 | auVar5;
      iVar7 = auVar6._4_4_;
      auVar11._4_4_ = iVar7;
      auVar11._0_4_ = iVar7;
      auVar11._8_4_ = auVar6._12_4_;
      auVar11._12_4_ = auVar6._12_4_;
      state->v1 = auVar6._0_4_ * -0x61c8864f;
      state->v2 = iVar7 * -0x61c8864f;
      state->mem32[0] = (XXH32_hash_t)((auVar6._8_8_ & 0xffffffff) * 0x9e3779b1);
      state->mem32[1] = (XXH32_hash_t)((auVar11._8_8_ & 0xffffffff) * 0x9e3779b1);
      input = (void *)((long)input + (ulong)(0x10 - state->memsize));
      state->memsize = 0;
    }
    if (input <= pauVar4 + -1) {
      XVar2 = state->v1;
      XVar13 = state->v2;
      XVar17 = state->v3;
      XVar14 = state->v4;
      do {
        auVar5 = *input;
        uVar1 = auVar5._0_4_ * -0x7a143589 + XVar2;
        uVar8 = auVar5._4_4_ * -0x7a143589 + XVar13;
        uVar9 = (int)((auVar5._8_8_ & 0xffffffff) * 0x85ebca77) + XVar17;
        uVar10 = auVar5._12_4_ * -0x7a143589 + XVar14;
        auVar12._0_4_ = uVar1 >> 0x13;
        auVar12._4_4_ = uVar8 >> 0x13;
        auVar12._8_4_ = uVar9 >> 0x13;
        auVar12._12_4_ = uVar10 >> 0x13;
        auVar16._0_4_ = uVar1 * 0x2000;
        auVar16._4_4_ = uVar8 * 0x2000;
        auVar16._8_4_ = uVar9 * 0x2000;
        auVar16._12_4_ = uVar10 * 0x2000;
        auVar16 = auVar16 | auVar12;
        XVar2 = auVar16._0_4_ * -0x61c8864f;
        XVar17 = (XXH32_hash_t)((auVar16._8_8_ & 0xffffffff) * 0x9e3779b1);
        XVar13 = auVar16._4_4_ * -0x61c8864f;
        XVar14 = auVar16._12_4_ * -0x61c8864f;
        input = (void *)((long)input + 0x10);
      } while (input <= pauVar4 + -1);
      state->v1 = XVar2;
      state->v2 = XVar13;
      state->v3 = XVar17;
      state->v4 = XVar14;
    }
    if (pauVar4 <= input) {
      return XXH_OK;
    }
    memcpy(state->mem32,input,(long)pauVar4 - (long)input);
    XVar2 = (XXH32_hash_t)((long)pauVar4 - (long)input);
  }
  state->memsize = XVar2;
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode
XXH32_update(XXH32_state_t* state, const void* input, size_t len)
{
    if (input==NULL)
#if defined(XXH_ACCEPT_NULL_INPUT_POINTER) && (XXH_ACCEPT_NULL_INPUT_POINTER>=1)
        return XXH_OK;
#else
        return XXH_ERROR;
#endif

    {   const xxh_u8* p = (const xxh_u8*)input;
        const xxh_u8* const bEnd = p + len;

        state->total_len_32 += (XXH32_hash_t)len;
        state->large_len |= (XXH32_hash_t)((len>=16) | (state->total_len_32>=16));

        if (state->memsize + len < 16)  {   /* fill in tmp buffer */
            XXH_memcpy((xxh_u8*)(state->mem32) + state->memsize, input, len);
            state->memsize += (XXH32_hash_t)len;
            return XXH_OK;
        }

        if (state->memsize) {   /* some data left from previous update */
            XXH_memcpy((xxh_u8*)(state->mem32) + state->memsize, input, 16-state->memsize);
            {   const xxh_u32* p32 = state->mem32;
                state->v1 = XXH32_round(state->v1, XXH_readLE32(p32)); p32++;
                state->v2 = XXH32_round(state->v2, XXH_readLE32(p32)); p32++;
                state->v3 = XXH32_round(state->v3, XXH_readLE32(p32)); p32++;
                state->v4 = XXH32_round(state->v4, XXH_readLE32(p32));
            }
            p += 16-state->memsize;
            state->memsize = 0;
        }

        if (p <= bEnd-16) {
            const xxh_u8* const limit = bEnd - 16;
            xxh_u32 v1 = state->v1;
            xxh_u32 v2 = state->v2;
            xxh_u32 v3 = state->v3;
            xxh_u32 v4 = state->v4;

            do {
                v1 = XXH32_round(v1, XXH_readLE32(p)); p+=4;
                v2 = XXH32_round(v2, XXH_readLE32(p)); p+=4;
                v3 = XXH32_round(v3, XXH_readLE32(p)); p+=4;
                v4 = XXH32_round(v4, XXH_readLE32(p)); p+=4;
            } while (p<=limit);

            state->v1 = v1;
            state->v2 = v2;
            state->v3 = v3;
            state->v4 = v4;
        }

        if (p < bEnd) {
            XXH_memcpy(state->mem32, p, (size_t)(bEnd-p));
            state->memsize = (unsigned)(bEnd-p);
        }
    }

    return XXH_OK;
}